

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommunicationsNodeID.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::CommunicationsNodeID::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,CommunicationsNodeID *this)

{
  ostream *poVar1;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  CommunicationsNodeID *local_18;
  CommunicationsNodeID *this_local;
  
  local_18 = this;
  this_local = (CommunicationsNodeID *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  EntityIdentifier::GetAsString_abi_cxx11_(&local_1c0,&this->super_EntityIdentifier);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"Element:     ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*(ushort *)
                              &(this->super_EntityIdentifier).super_SimulationIdentifier.field_0xe);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString CommunicationsNodeID::GetAsString() const
{
    KStringStream ss;

    ss << EntityIdentifier::GetAsString()
       << "Element:     " << m_ui16ElementID << "\n";

    return ss.str();
}